

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O1

Result_Type
chaiscript::detail::
Cast_Helper_Inner<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
::cast(Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  bad_any_cast *this;
  
  bVar1 = Type_Info::bare_equal_type_info
                    (&((ob->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    return (Result_Type)
           ((ob->m_data).
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_const_data_ptr;
  }
  this = (bad_any_cast *)__cxa_allocate_exception(0x28);
  exception::bad_any_cast::bad_any_cast(this);
  __cxa_throw(this,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            return static_cast<const Result *>(ob.get_const_ptr());
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }